

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O2

void nn_sub_init(nn_options_t *options,int sock)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  long lVar3;
  
  iVar1 = (options->subscriptions).num;
  if (iVar1 != 0) {
    for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
      __s = (options->subscriptions).items[lVar3];
      sVar2 = strlen(__s);
      iVar1 = nn_setsockopt(sock,0x21,1,__s,sVar2);
      nn_assert_errno((uint)(iVar1 == 0),"Can\'t subscribe");
      iVar1 = (options->subscriptions).num;
    }
    return;
  }
  iVar1 = nn_setsockopt(sock,0x21,1,"",0);
  nn_assert_errno((uint)(iVar1 == 0),"Can\'t subscribe");
  return;
}

Assistant:

void nn_sub_init (nn_options_t *options, int sock)
{
    int i;
    int rc;

    if (options->subscriptions.num) {
        for (i = 0; i < options->subscriptions.num; ++i) {
            rc = nn_setsockopt (sock, NN_SUB, NN_SUB_SUBSCRIBE,
                options->subscriptions.items[i],
                strlen (options->subscriptions.items[i]));
            nn_assert_errno (rc == 0, "Can't subscribe");
        }
    } else {
        rc = nn_setsockopt (sock, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
        nn_assert_errno (rc == 0, "Can't subscribe");
    }
}